

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O3

void __thiscall AllocatorTest_allocator_ref_Test::TestBody(AllocatorTest_allocator_ref_Test *this)

{
  mock_allocator<int> *alloc_00;
  bool bVar1;
  char *message;
  AssertionResult gtest_ar;
  test_allocator_ref ref3;
  test_allocator_ref ref;
  test_allocator_ref ref2;
  StrictMock<mock_allocator<int>_> alloc;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_130;
  AssertHelper local_128;
  internal local_120 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_118;
  allocator_ref<mock_allocator<int>_> local_110;
  allocator_ref<mock_allocator<int>_> local_108;
  allocator_ref<mock_allocator<int>_> local_100;
  StrictMock<mock_allocator<int>_> local_f8;
  
  testing::StrictMock<mock_allocator<int>_>::StrictMock(&local_f8);
  alloc_00 = &local_f8.super_mock_allocator<int>;
  local_108.alloc_ = alloc_00;
  check_forwarding(alloc_00,&local_108);
  local_100.alloc_ = alloc_00;
  check_forwarding(alloc_00,&local_100);
  local_110.alloc_ = (mock_allocator<int> *)0x0;
  local_130.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_128.data_ = (AssertHelperData *)0x0;
  testing::internal::CmpHelperEQ<mock_allocator<int>*,mock_allocator<int>*>
            (local_120,"nullptr","ref3.get()",(mock_allocator<int> **)&local_128,
             (mock_allocator<int> **)&local_130);
  if (local_120[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_130);
    if (local_118.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      message = "";
    }
    else {
      message = ((local_118.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x118,message);
    testing::internal::AssertHelper::operator=(&local_128,(Message *)&local_130);
    testing::internal::AssertHelper::~AssertHelper(&local_128);
    if (local_130.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_130.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_130.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_118,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_110.alloc_ = local_108.alloc_;
  check_forwarding(alloc_00,&local_110);
  testing::StrictMock<mock_allocator<int>_>::~StrictMock(&local_f8);
  return;
}

Assistant:

TEST(AllocatorTest, allocator_ref) {
  StrictMock< mock_allocator<int> > alloc;
  typedef allocator_ref< mock_allocator<int> > test_allocator_ref;
  test_allocator_ref ref(&alloc);
  // Check if allocator_ref forwards to the underlying allocator.
  check_forwarding(alloc, ref);
  test_allocator_ref ref2(ref);
  check_forwarding(alloc, ref2);
  test_allocator_ref ref3;
  EXPECT_EQ(FMT_NULL, ref3.get());
  ref3 = ref;
  check_forwarding(alloc, ref3);
}